

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseEnumeratedType(xmlParserCtxtPtr ctxt,xmlEnumerationPtr *tree)

{
  xmlParserInputPtr pxVar1;
  xmlChar *pxVar2;
  int iVar3;
  xmlEnumerationPtr pxVar4;
  
  pxVar1 = ctxt->input;
  pxVar2 = pxVar1->cur;
  if (((((*pxVar2 == 'N') && (pxVar2[1] == 'O')) && (pxVar2[2] == 'T')) &&
      ((pxVar2[3] == 'A' && (pxVar2[4] == 'T')))) &&
     ((pxVar2[5] == 'I' && ((pxVar2[6] == 'O' && (pxVar2[7] == 'N')))))) {
    pxVar1->cur = pxVar2 + 8;
    pxVar1->col = pxVar1->col + 8;
    if (pxVar2[8] == '\0') {
      xmlParserGrow(ctxt);
    }
    iVar3 = xmlSkipBlankCharsPE(ctxt);
    if (iVar3 == 0) {
      xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'NOTATION\'\n");
      iVar3 = 0;
    }
    else {
      pxVar4 = xmlParseNotationType(ctxt);
      *tree = pxVar4;
      iVar3 = 10;
      if (pxVar4 == (xmlEnumerationPtr)0x0) {
        iVar3 = 0;
      }
    }
  }
  else {
    pxVar4 = xmlParseEnumerationType(ctxt);
    *tree = pxVar4;
    iVar3 = (uint)(pxVar4 != (xmlEnumerationPtr)0x0) * 9;
  }
  return iVar3;
}

Assistant:

int
xmlParseEnumeratedType(xmlParserCtxtPtr ctxt, xmlEnumerationPtr *tree) {
    if (CMP8(CUR_PTR, 'N', 'O', 'T', 'A', 'T', 'I', 'O', 'N')) {
	SKIP(8);
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after 'NOTATION'\n");
	    return(0);
	}
	*tree = xmlParseNotationType(ctxt);
	if (*tree == NULL) return(0);
	return(XML_ATTRIBUTE_NOTATION);
    }
    *tree = xmlParseEnumerationType(ctxt);
    if (*tree == NULL) return(0);
    return(XML_ATTRIBUTE_ENUMERATION);
}